

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall
t_dart_generator::generate_service_helpers(t_dart_generator *this,t_service *tservice)

{
  t_struct *tstruct;
  pointer pptVar1;
  char *__end;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_68;
  vector<t_function_*,_std::allocator<t_function_*>_> local_48;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_48,&tservice->functions_);
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar1 = local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      tstruct = (*pptVar1)->arglist_;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
      generate_dart_struct_definition
                (this,(ostream *)&this->f_service_,tstruct,false,false,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      generate_function_helpers(this,*pptVar1);
      pptVar1 = pptVar1 + 1;
    } while (pptVar1 !=
             local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_dart_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_dart_struct_definition(f_service_, ts, false, false);
    generate_function_helpers(*f_iter);
  }
}